

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_comm.cpp
# Opt level: O2

void __thiscall Omega_h::Comm::Comm(Comm *this,Library *library_in,bool is_graph,bool sends_to_self)

{
  Read<int> *this_00;
  LO LVar1;
  undefined7 in_register_00000011;
  initializer_list<int> l;
  allocator local_7d;
  int local_7c;
  string local_78;
  Write<int> local_58;
  Write<int> local_48;
  Write<int> local_38;
  
  this->library_ = library_in;
  this_00 = &this->srcs_;
  (this->srcs_).write_.shared_alloc_.alloc = (Alloc *)0x0;
  (this->srcs_).write_.shared_alloc_.direct_ptr = (void *)0x0;
  (this->dsts_).write_.shared_alloc_.alloc = (Alloc *)0x0;
  (this->dsts_).write_.shared_alloc_.direct_ptr = (void *)0x0;
  (this->host_srcs_).read_.write_.shared_alloc_.alloc = (Alloc *)0x0;
  (this->host_srcs_).read_.write_.shared_alloc_.direct_ptr = (void *)0x0;
  (this->host_dsts_).read_.write_.shared_alloc_.alloc = (Alloc *)0x0;
  (this->host_dsts_).read_.write_.shared_alloc_.direct_ptr = (void *)0x0;
  if ((int)CONCAT71(in_register_00000011,is_graph) == 0) {
    if (sends_to_self) {
      fail("assertion %s failed at %s +%d\n","!sends_to_self",
           "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_comm.cpp"
           ,0x3f);
    }
  }
  else {
    if (sends_to_self) {
      local_7c = 0;
      std::__cxx11::string::string((string *)&local_78,"",&local_7d);
      l._M_len = 1;
      l._M_array = &local_7c;
      Read<int>::Read((Read<int> *)&local_58,l,&local_78);
      Write<int>::operator=(&this_00->write_,&local_58);
      Write<int>::~Write(&local_58);
      std::__cxx11::string::~string((string *)&local_78);
      LVar1 = 0;
    }
    else {
      std::__cxx11::string::string((string *)&local_78,"",(allocator *)&local_7c);
      Read<int>::Read((Read<int> *)&local_58,(initializer_list<int>)ZEXT816(0),&local_78);
      Write<int>::operator=(&this_00->write_,&local_58);
      Write<int>::~Write(&local_58);
      std::__cxx11::string::~string((string *)&local_78);
      LVar1 = -1;
    }
    this->self_dst_ = LVar1;
    this->self_src_ = LVar1;
    Write<int>::operator=(&(this->dsts_).write_,&this_00->write_);
    Write<int>::Write(&local_38,&this_00->write_);
    HostRead<int>::HostRead((HostRead<int> *)&local_78,(Read<signed_char> *)&local_38);
    Write<int>::operator=((Write<int> *)&this->host_srcs_,(Write<int> *)&local_78);
    Write<int>::~Write((Write<int> *)&local_78);
    Write<int>::~Write(&local_38);
    Write<int>::Write(&local_48,&(this->dsts_).write_);
    HostRead<int>::HostRead((HostRead<int> *)&local_78,(Read<signed_char> *)&local_48);
    Write<int>::operator=((Write<int> *)&this->host_dsts_,(Write<int> *)&local_78);
    Write<int>::~Write((Write<int> *)&local_78);
    Write<int>::~Write(&local_48);
  }
  return;
}

Assistant:

Comm::Comm(Library* library_in, bool is_graph, bool sends_to_self)
    : library_(library_in) {
  if (is_graph) {
    if (sends_to_self) {
      srcs_ = Read<LO>({0});
      self_src_ = self_dst_ = 0;
    } else {
      srcs_ = Read<LO>({});
      self_src_ = self_dst_ = -1;
    }
    dsts_ = srcs_;
    host_srcs_ = HostRead<I32>(srcs_);
    host_dsts_ = HostRead<I32>(dsts_);
  } else {
    OMEGA_H_CHECK(!sends_to_self);
  }
}